

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O2

void Cmd_invnext(FCommandLine *argv,APlayerPawn *who,int key)

{
  TObjPtr<AInventory> *obj;
  TObjPtr<AInventory> *obj_00;
  FFont *font;
  DBaseStatusBar *this;
  AInventory *pAVar1;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar2;
  DHUDMessageFadeOut *this_00;
  char *text;
  
  if (who != (APlayerPawn *)0x0) {
    obj = &who->InvSel;
    pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
    if (pAVar1 != (AInventory *)0x0) {
      pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
      aVar2.p = AInventory::NextInv(pAVar1);
      if (aVar2.p == (AInventory *)0x0) {
        obj_00 = &(who->super_AActor).Inventory;
        pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
        if ((pAVar1->ItemFlags & 0x40) == 0) {
          pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
          aVar2.p = AInventory::NextInv(pAVar1);
        }
        else {
          aVar2.p = *(AInventory **)&obj_00->field_0;
        }
      }
      (obj->field_0).p = (AInventory *)aVar2;
      if (((((byte)displaynametags.Value & 1) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) &&
         (SmallFont != (FFont *)0x0)) {
        pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
        this = StatusBar;
        if (pAVar1 != (AInventory *)0x0) {
          this_00 = (DHUDMessageFadeOut *)DObject::operator_new(200);
          font = SmallFont;
          pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
          text = AActor::GetTag(&pAVar1->super_AActor,(char *)0x0);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (this_00,font,text,1.5,0.8,0,0,nametagcolor.Value,2.0,0.35);
          DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x564e4953,0);
        }
      }
    }
    ((who->super_AActor).player)->inventorytics = 0xaf;
  }
  return;
}

Assistant:

CCMD (invnext)
{
	AInventory *next;

	if (who == NULL)
		return;

	if (who->InvSel != NULL)
	{
		if ((next = who->InvSel->NextInv()) != NULL)
		{
			who->InvSel = next;
		}
		else
		{
			// Select the first item in the inventory
			if (!(who->Inventory->ItemFlags & IF_INVBAR))
			{
				who->InvSel = who->Inventory->NextInv();
			}
			else
			{
				who->InvSel = who->Inventory;
			}
		}
		if ((displaynametags & 1) && StatusBar && SmallFont && who->InvSel)
			StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, who->InvSel->GetTag(), 
			1.5f, 0.80f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID('S','I','N','V'));
	}
	who->player->inventorytics = 5*TICRATE;
}